

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.cpp
# Opt level: O1

string * anon_unknown.dwarf_9b16::generate_content
                   (string *__return_storage_ptr__,Output *output,char *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  streambuf *psVar2;
  ostringstream contents;
  ifstream stream;
  string local_3d0 [3];
  ios_base local_360 [264];
  undefined1 *local_258;
  long local_250;
  undefined1 local_248 [16];
  undefined1 local_238 [32];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,"templates/greg.h.in",_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238._0_8_ + -0x18)] & 5) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
    psVar2 = (streambuf *)(local_238 + 0x10);
    std::ostream::operator<<((ostream *)local_3d0,psVar2);
    std::__cxx11::stringbuf::str();
    (__return_storage_ptr__->super_string)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->super_string).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_258,local_258 + local_250);
    if (local_258 != local_248) {
      operator_delete(local_258);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
    std::ios_base::~ios_base(local_360);
    std::ifstream::~ifstream(local_238);
    paVar1 = &local_3d0[0].field_2;
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@API_NAME@","");
    wire::string::replace((string *)local_238,__return_storage_ptr__,local_3d0,(string *)output);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@TYPE_TYPEDEFS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->type_typedefs).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@ENUM_DEFINITIONS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->enum_definitions).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@EXT_MACROS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->ext_macros).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@VER_MACROS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->ver_macros).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@EXT_DECLARATIONS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->ext_declarations).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@VER_DECLARATIONS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->ver_declarations).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@EXT_DEFINITIONS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->ext_definitions).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@VER_DEFINITIONS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->ver_definitions).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@VER_LOADERS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->ver_loaders).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@EXT_LOADERS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->ext_loaders).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@CMD_TYPEDEFS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->cmd_typedefs).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@CMD_DECLARATIONS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->cmd_declarations).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@CMD_MACROS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->cmd_macros).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@CMD_DEFINITIONS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->cmd_definitions).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    local_3d0[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"@CMD_LOADERS@","");
    wire::string::replace
              ((string *)local_238,__return_storage_ptr__,local_3d0,
               &(output->cmd_loaders).super_string);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_238);
    if ((streambuf *)local_238._0_8_ != psVar2) {
      operator_delete((void *)local_238._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_3d0[0]._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  puts("File not found");
  exit(1);
}

Assistant:

wire::string generate_content(const Output& output, const char* path)
{
  wire::string text = read_file(path);

  text = text.replace("@API_NAME@", output.api_name);
  text = text.replace("@TYPE_TYPEDEFS@", output.type_typedefs);
  text = text.replace("@ENUM_DEFINITIONS@", output.enum_definitions);
  text = text.replace("@EXT_MACROS@", output.ext_macros);
  text = text.replace("@VER_MACROS@", output.ver_macros);
  text = text.replace("@EXT_DECLARATIONS@", output.ext_declarations);
  text = text.replace("@VER_DECLARATIONS@", output.ver_declarations);
  text = text.replace("@EXT_DEFINITIONS@", output.ext_definitions);
  text = text.replace("@VER_DEFINITIONS@", output.ver_definitions);
  text = text.replace("@VER_LOADERS@", output.ver_loaders);
  text = text.replace("@EXT_LOADERS@", output.ext_loaders);
  text = text.replace("@CMD_TYPEDEFS@", output.cmd_typedefs);
  text = text.replace("@CMD_DECLARATIONS@", output.cmd_declarations);
  text = text.replace("@CMD_MACROS@", output.cmd_macros);
  text = text.replace("@CMD_DEFINITIONS@", output.cmd_definitions);
  text = text.replace("@CMD_LOADERS@", output.cmd_loaders);

  return text;
}